

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

_Bool parse_semicolon(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_t gVar1;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  gVar1 = gravity_lexer_peek(lexer_00);
  if (gVar1 == TOK_OP_SEMICOLON) {
    gravity_lexer_next(lexer_00);
  }
  return gVar1 == TOK_OP_SEMICOLON;
}

Assistant:

static bool parse_semicolon (gravity_parser_t *parser) {
    #if SEMICOLON_IS_OPTIONAL
    DECLARE_LEXER;
    if (gravity_lexer_peek(lexer) == TOK_OP_SEMICOLON) {gravity_lexer_next(lexer); return true;}
    return false;
    #else
    return parse_required(parser, TOK_OP_SEMICOLON);
    #endif
}